

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpivotL.c
# Opt level: O1

int zpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int_t iVar4;
  void *pvVar5;
  int_t *piVar6;
  double dVar7;
  undefined8 uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  double *pdVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  doublecomplex *z;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  doublecomplex temp;
  doublecomplex one;
  doublecomplex local_98;
  long local_80;
  long local_78;
  double local_70;
  int *local_68;
  ulong local_60;
  long local_58;
  flops_t *local_50;
  doublecomplex local_48;
  
  local_48.r = 1.0;
  local_48.i = 0.0;
  local_50 = stat->ops;
  pvVar5 = Glu->lusup;
  local_80 = (long)Glu->xsup[Glu->supno[jcol]];
  iVar10 = Glu->xlsub[local_80];
  iVar16 = Glu->xlsub[local_80 + 1] - iVar10;
  local_58 = (long)Glu->xlusup[local_80];
  piVar6 = Glu->lsub;
  uVar18 = jcol - Glu->xsup[Glu->supno[jcol]];
  lVar13 = (long)Glu->xlusup[jcol] * 0x10;
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  uVar19 = 0xffffffff;
  uVar12 = 0xffffffff;
  dVar24 = 0.0;
  local_60 = (ulong)(iVar16 - uVar18);
  uVar20 = uVar18;
  uVar15 = uVar18;
  local_78 = lVar13;
  local_70 = u;
  local_68 = perm_r;
  if (iVar16 - uVar18 != 0 && (int)uVar18 <= iVar16) {
    iVar3 = iperm_c[jcol];
    uVar17 = (ulong)(int)uVar18;
    z = (doublecomplex *)((long)pvVar5 + uVar17 * 0x10 + lVar13);
    uVar22 = 0;
    uVar23 = 0;
    do {
      dVar7 = (double)CONCAT44(uVar23,uVar22);
      dVar24 = z_abs1(z);
      if (dVar7 < dVar24) {
        uVar15 = (uint)uVar17;
      }
      if ((*usepr != 0) && (piVar6[(long)iVar10 + uVar17] == *pivrow)) {
        uVar20 = (uint)uVar17;
      }
      if (dVar24 <= dVar7) {
        dVar24 = dVar7;
      }
      if (piVar6[(long)iVar10 + uVar17] == iVar3) {
        uVar19 = uVar17 & 0xffffffff;
      }
      uVar12 = (uint)uVar19;
      uVar17 = uVar17 + 1;
      z = z + 1;
      uVar22 = SUB84(dVar24,0);
      uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
    } while ((long)uVar17 < (long)iVar16);
  }
  if ((dVar24 != 0.0) || (NAN(dVar24))) {
    dVar24 = dVar24 * local_70;
    uVar21 = uVar15;
    if (*usepr != 0) {
      dVar7 = z_abs1((doublecomplex *)((long)pvVar5 + (long)(int)uVar20 * 0x10 + lVar13));
      if (((dVar7 == 0.0) && (!NAN(dVar7))) || (uVar21 = uVar20, dVar7 < dVar24)) {
        *usepr = 0;
        uVar21 = uVar15;
      }
    }
    lVar9 = local_58;
    if (*usepr == 0) {
      if (-1 < (int)uVar12) {
        dVar7 = z_abs1((doublecomplex *)((long)pvVar5 + (ulong)uVar12 * 0x10 + lVar13));
        if (dVar7 < dVar24) {
          uVar12 = uVar21;
        }
        if (dVar7 != 0.0) {
          uVar21 = uVar12;
        }
        if (NAN(dVar7)) {
          uVar21 = uVar12;
        }
      }
      *pivrow = piVar6[(long)iVar10 + (long)(int)uVar21];
    }
    local_68[*pivrow] = jcol;
    lVar11 = (long)(int)uVar18;
    if (uVar21 != uVar18) {
      iVar4 = piVar6[(long)iVar10 + (long)(int)uVar21];
      piVar6[(long)iVar10 + (long)(int)uVar21] = piVar6[iVar10 + lVar11];
      piVar6[iVar10 + lVar11] = iVar4;
      if (-1 < (int)uVar18) {
        uVar19 = (ulong)((jcol - (int)local_80) + 1);
        uVar12 = uVar18;
        do {
          pdVar14 = (double *)((long)pvVar5 + (long)(int)uVar21 * 0x10 + lVar9 * 0x10);
          local_98.r = *pdVar14;
          local_98.i = pdVar14[1];
          puVar1 = (undefined8 *)((long)pvVar5 + (long)(int)uVar12 * 0x10 + lVar9 * 0x10);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)pvVar5 + (long)(int)uVar21 * 0x10 + lVar9 * 0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          pdVar14 = (double *)((long)pvVar5 + (long)(int)uVar12 * 0x10 + lVar9 * 0x10);
          *pdVar14 = local_98.r;
          pdVar14[1] = local_98.i;
          uVar12 = uVar12 + iVar16;
          uVar21 = uVar21 + iVar16;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
    }
    local_50[7] = (float)((int)local_60 * 10) + local_50[7];
    z_div(&local_98,&local_48,(doublecomplex *)((long)pvVar5 + lVar11 * 0x10 + lVar13));
    iVar10 = 0;
    if ((int)(uVar18 + 1) < iVar16) {
      lVar13 = (long)(int)(uVar18 + 1);
      pdVar14 = (double *)((long)pvVar5 + local_78 + lVar13 * 0x10 + 8);
      do {
        dVar24 = pdVar14[-1];
        pdVar14[-1] = dVar24 * local_98.r - local_98.i * *pdVar14;
        *pdVar14 = *pdVar14 * local_98.r + dVar24 * local_98.i;
        lVar13 = lVar13 + 1;
        pdVar14 = pdVar14 + 2;
      } while (lVar13 < iVar16);
    }
  }
  else {
    *usepr = 0;
    iVar10 = jcol + 1;
  }
  return iVar10;
}

Assistant:

int
zpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    doublecomplex one = {1.0, 0.0};
    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    double       pivmax, rtemp, thresh;
    doublecomplex       temp;
    doublecomplex       *lu_sup_ptr; 
    doublecomplex       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (doublecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
        rtemp = z_abs1 (&lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = z_abs1 (&lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
            rtemp = z_abs1 (&lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += 10 * (nsupr - nsupc);

    z_div(&temp, &one, &lu_col_ptr[nsupc]);
    for (k = nsupc+1; k < nsupr; k++) 
	zz_mult(&lu_col_ptr[k], &lu_col_ptr[k], &temp);

    return 0;
}